

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParallelSieve.cpp
# Opt level: O0

void __thiscall primesieve::ParallelSieve::sieve(ParallelSieve *this)

{
  size_t sVar1;
  future<primesieve::Array<unsigned_long,_6UL>_> *pfVar2;
  type __d;
  PrimeSieve *in_RDI;
  rep_conflict rVar3;
  duration<double,_std::ratio<1L,_1L>_> seconds;
  time_point t2;
  future<primesieve::Array<unsigned_long,_6UL>_> *f;
  future<primesieve::Array<unsigned_long,_6UL>_> *__end2;
  future<primesieve::Array<unsigned_long,_6UL>_> *__begin2;
  Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
  *__range2;
  int t;
  Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
  futures;
  type task;
  atomic<unsigned_long> a;
  uint64_t iters;
  uint64_t threadDist;
  uint64_t dist;
  time_point t1;
  int threads;
  future<primesieve::Array<unsigned_long,_6UL>_> *in_stack_fffffffffffffeb8;
  PrimeSieve *in_stack_fffffffffffffec0;
  ParallelSieve *in_stack_fffffffffffffec8;
  PrimeSieve *in_stack_fffffffffffffed0;
  PrimeSieve *this_00;
  duration<double,_std::ratio<1L,_1L>_> in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  int threads_00;
  ParallelSieve *in_stack_ffffffffffffff00;
  Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
  *in_stack_ffffffffffffff08;
  type *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  future<primesieve::Array<unsigned_long,_6UL>_> *local_c0;
  undefined1 local_b0 [16];
  int local_a0;
  PrimeSieve local_90;
  unsigned_long local_18;
  undefined1 *local_10;
  PrimeSieve *local_8;
  
  threads_00 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  PrimeSieve::reset(in_stack_fffffffffffffec0);
  if (in_RDI->start_ <= in_RDI->stop_) {
    local_90.updateDistance_._4_4_ = idealNumThreads(in_stack_fffffffffffffec8);
    if (local_90.updateDistance_._4_4_ == 1) {
      PrimeSieve::sieve((PrimeSieve *)task.iters);
    }
    else {
      PrimeSieve::setStatus(in_stack_fffffffffffffed0,(double)in_stack_fffffffffffffec8);
      local_90.sievedDistance_ = std::chrono::_V2::system_clock::now();
      local_90.counts_.array_[5] = PrimeSieve::getDistance(in_RDI);
      local_90.counts_.array_[4] = getThreadDistance(in_stack_ffffffffffffff00,threads_00);
      local_90.counts_.array_[3] = (local_90.counts_.array_[5] - 1) / local_90.counts_.array_[4] + 1
      ;
      local_90.updateDistance_._4_4_ =
           (anonymous_namespace)::inBetween<int,int,unsigned_long>
                     (1,local_90.updateDistance_._4_4_,local_90.counts_.array_[3]);
      local_90.counts_.array_[2] = 0;
      local_90.percent_ = (double)(local_90.counts_.array_ + 2);
      local_90.counts_.array_[0] = (unsigned_long)(local_90.counts_.array_ + 3);
      local_90.counts_.array_[1] = (unsigned_long)(local_90.counts_.array_ + 4);
      this_00 = &local_90;
      Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
      ::Vector((Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
                *)this_00);
      Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
      ::reserve((Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
                 *)in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
      for (local_a0 = 0; local_a0 < local_90.updateDistance_._4_4_; local_a0 = local_a0 + 1) {
        std::async<primesieve::ParallelSieve::sieve()::__0&>
                  ((launch)((ulong)in_stack_ffffffffffffff38 >> 0x20),in_stack_ffffffffffffff30);
        in_stack_fffffffffffffed0 = &local_90;
        local_10 = local_b0;
        local_8 = in_stack_fffffffffffffed0;
        if (local_90.start_ == local_90.stop_) {
          local_18 = 1;
          sVar1 = Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
                  ::capacity((Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
                              *)in_stack_fffffffffffffed0);
          local_90.parent_ = (ParallelSieve *)(sVar1 * 2);
          std::max<unsigned_long>(&local_18,(unsigned_long *)&local_90.parent_);
          Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
          ::reserve_unchecked(in_stack_ffffffffffffff08,(size_t)in_stack_ffffffffffffff00);
        }
        std::future<primesieve::Array<unsigned_long,_6UL>_>::future
                  ((future<primesieve::Array<unsigned_long,_6UL>_> *)in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8);
        in_stack_fffffffffffffed0->start_ =
             (uint64_t)
             ((future<primesieve::Array<unsigned_long,_6UL>_> *)in_stack_fffffffffffffed0->start_ +
             1);
        std::future<primesieve::Array<unsigned_long,_6UL>_>::~future
                  ((future<primesieve::Array<unsigned_long,_6UL>_> *)0x1be80c);
      }
      local_c0 = Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
                 ::begin((Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
                          *)&local_90);
      pfVar2 = Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
               ::end((Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
                      *)&local_90);
      for (; local_c0 != pfVar2; local_c0 = local_c0 + 1) {
        std::future<primesieve::Array<unsigned_long,_6UL>_>::get
                  ((future<primesieve::Array<unsigned_long,_6UL>_> *)in_stack_fffffffffffffef0.__r);
        anon_unknown.dwarf_133bb4::operator+=
                  ((counts_t *)in_stack_fffffffffffffed0,(counts_t *)in_stack_fffffffffffffec8);
      }
      std::chrono::_V2::system_clock::now();
      __d = std::chrono::operator-
                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffffec8,
                       (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_fffffffffffffec0);
      std::chrono::duration<double,std::ratio<1l,1l>>::
      duration<long,std::ratio<1l,1000000000l>,void>
                ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffed0,
                 (duration<long,_std::ratio<1L,_1000000000L>_> *)__d.__r);
      rVar3 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                        ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xfffffffffffffef0);
      in_RDI->seconds_ = rVar3;
      PrimeSieve::setStatus(in_stack_fffffffffffffed0,(double)__d.__r);
      Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
      ::~Vector((Vector<std::future<primesieve::Array<unsigned_long,_6UL>_>,_std::allocator<std::future<primesieve::Array<unsigned_long,_6UL>_>_>_>
                 *)this_00);
    }
  }
  return;
}

Assistant:

void ParallelSieve::sieve()
{
  reset();

  if (start_ > stop_)
    return;

  int threads = idealNumThreads();

  if (threads == 1)
    PrimeSieve::sieve();
  else
  {
    setStatus(0);
    auto t1 = std::chrono::system_clock::now();
    uint64_t dist = getDistance();
    uint64_t threadDist = getThreadDistance(threads);
    uint64_t iters = ((dist - 1) / threadDist) + 1;
    threads = inBetween(1, threads, iters);
    std::atomic<uint64_t> a(0);

    // Each thread executes 1 task
    auto task = [&]()
    {
      PrimeSieve ps(this);
      uint64_t i;
      counts_t counts;
      counts.fill(0);

      while ((i = a.fetch_add(1, std::memory_order_relaxed)) < iters)
      {
        uint64_t start = start_ + threadDist * i;
        uint64_t stop = checkedAdd(start, threadDist);
        stop = align(stop);

        if (start > start_)
          start = align(start) + 1;

        // Sieve the primes inside [start, stop]
        ps.sieve(start, stop);
        counts += ps.getCounts();
      }

      return counts;
    };

    Vector<std::future<counts_t>> futures;
    futures.reserve(threads);

    for (int t = 0; t < threads; t++)
      futures.emplace_back(std::async(std::launch::async, task));

    for (auto& f : futures)
      counts_ += f.get();

    auto t2 = std::chrono::system_clock::now();
    std::chrono::duration<double> seconds = t2 - t1;
    seconds_ = seconds.count();
    setStatus(100);
  }
}